

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManFree(Mf_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  void *__ptr;
  int *piVar2;
  void **__ptr_00;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  if ((p->pPars->fGenCnf != 0) && ((p->vCnfSizes).nSize != p->vTtMem->nEntries)) {
    __assert_fail("!p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x585,"void Mf_ManFree(Mf_Man_t *)");
  }
  if ((p->pPars->fCutMin == 0) || (pVVar1 = p->vTtMem, pVVar1 == (Vec_Mem_t *)0x0))
  goto LAB_007804eb;
  pVVar4 = pVVar1->vTable;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar1->vTable->pArray = (int *)0x0;
      pVVar4 = pVVar1->vTable;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_007804af;
    }
    free(pVVar4);
    pVVar1->vTable = (Vec_Int_t *)0x0;
  }
LAB_007804af:
  pVVar4 = pVVar1->vNexts;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar1->vNexts->pArray = (int *)0x0;
      pVVar4 = pVVar1->vNexts;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_007804eb;
    }
    free(pVVar4);
    pVVar1->vNexts = (Vec_Int_t *)0x0;
  }
LAB_007804eb:
  if (p->pPars->fCutMin != 0) {
    pVVar1 = p->vTtMem;
    iVar3 = pVVar1->iPage;
    if (-1 < iVar3) {
      lVar5 = -1;
      do {
        if (pVVar1->ppPages[lVar5 + 1] != (word *)0x0) {
          free(pVVar1->ppPages[lVar5 + 1]);
          pVVar1->ppPages[lVar5 + 1] = (word *)0x0;
          iVar3 = pVVar1->iPage;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
    }
    if (pVVar1->ppPages != (word **)0x0) {
      free(pVVar1->ppPages);
    }
    free(pVVar1);
  }
  iVar3 = (p->vPages).nSize;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      __ptr = (p->vPages).pArray[lVar5];
      if ((void *)0x2 < __ptr) {
        free(__ptr);
        iVar3 = (p->vPages).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  piVar2 = (p->vCnfSizes).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCnfSizes).pArray = (int *)0x0;
  }
  piVar2 = (p->vCnfMem).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCnfMem).pArray = (int *)0x0;
  }
  __ptr_00 = (p->vPages).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar2 = (p->vTemp).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vTemp).pArray = (int *)0x0;
  }
  if (p->pLfObjs != (Mf_Obj_t *)0x0) {
    free(p->pLfObjs);
  }
  free(p);
  return;
}

Assistant:

void Mf_ManFree( Mf_Man_t * p )
{
    assert( !p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem) );
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vCnfSizes.pArray );
    ABC_FREE( p->vCnfMem.pArray );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vTemp.pArray );
    ABC_FREE( p->pLfObjs );
    ABC_FREE( p );
}